

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O0

void pztopology::TPZPyramid::AdjustTopDirections<double>
               (int ConstrainedFace,TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  undefined4 in_EDI;
  double dVar5;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  TPZManVector<double,_3> ar12;
  TPZManVector<double,_3> ar11;
  TPZManVector<double,_3> ar10;
  TPZManVector<double,_3> ar9;
  TPZManVector<double,_3> v3;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  double detjac;
  int vectors [4];
  TPZManVector<double,_3> *in_stack_fffffffffffffb80;
  double *in_stack_fffffffffffffb90;
  _func_int **in_stack_fffffffffffffb98;
  TPZFMatrix<double> *in_stack_fffffffffffffba0;
  TPZFMatrix<double> *in_stack_fffffffffffffca0;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  TPZVec<double> local_1c8;
  TPZVec<double> local_190;
  TPZVec<double> local_158;
  TPZVec<double> local_120;
  TPZVec<double> local_e8 [2];
  TPZVec<double> local_a0;
  _func_int **in_stack_ffffffffffffff98;
  double *in_stack_ffffffffffffffa0;
  
  dVar5 = TPZAxesTools<double>::ComputeDetjac(in_stack_fffffffffffffca0);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98
            );
  for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                        (int64_t)in_stack_fffffffffffffb90);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1cc);
    *pdVar4 = dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                        (int64_t)in_stack_fffffffffffffb90);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1cc);
    *pdVar4 = dVar1;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                        (int64_t)in_stack_fffffffffffffb90);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1cc);
    *pdVar4 = dVar1;
  }
  for (local_1d0 = 0; local_1d0 < 3; local_1d0 = local_1d0 + 1) {
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d0);
    *pdVar4 = *pdVar4 / dVar5;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d0);
    *pdVar4 = *pdVar4 / dVar5;
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1d0);
    *pdVar4 = *pdVar4 / dVar5;
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1d0);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d0);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d0);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_120,(long)local_1d0);
    *pdVar4 = dVar1 - (-dVar2 - dVar3);
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1d0);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d0);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d0);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_158,(long)local_1d0);
    *pdVar4 = dVar1 - (dVar2 - dVar3);
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1d0);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d0);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d0);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_190,(long)local_1d0);
    *pdVar4 = dVar1 - (dVar2 + dVar3);
    pdVar4 = TPZVec<double>::operator[](local_e8,(long)local_1d0);
    dVar1 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d0);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d0);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_1c8,(long)local_1d0);
    *pdVar4 = dVar1 - (dVar2 - dVar3);
  }
  switch(in_EDI) {
  case 1:
    for (local_1d4 = 0; local_1d4 < 3; local_1d4 = local_1d4 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = 0.0;
      pdVar4 = TPZVec<double>::operator[](&local_1c8,(long)local_1d4);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
      pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1d4);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.5;
      pdVar4 = TPZVec<double>::operator[](&local_190,(long)local_1d4);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
    }
    break;
  case 2:
    for (local_1d8 = 0; local_1d8 < 3; local_1d8 = local_1d8 + 1) {
      pdVar4 = TPZVec<double>::operator[](&local_1c8,(long)local_1d8);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = 0.0;
      pdVar4 = TPZVec<double>::operator[](&local_120,(long)local_1d8);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
      pdVar4 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1d8);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * -0.5;
    }
    break;
  case 3:
    for (local_1dc = 0; local_1dc < 3; local_1dc = local_1dc + 1) {
      pdVar4 = TPZVec<double>::operator[](&local_a0,(long)local_1dc);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * -0.5;
      pdVar4 = TPZVec<double>::operator[](&local_120,(long)local_1dc);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = 0.0;
      pdVar4 = TPZVec<double>::operator[](&local_158,(long)local_1dc);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
    }
    break;
  case 4:
    for (local_1e0 = 0; local_1e0 < 3; local_1e0 = local_1e0 + 1) {
      pdVar4 = TPZVec<double>::operator[](&local_190,(long)local_1e0);
      dVar5 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = dVar5 * 0.25;
      pdVar4 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&stack0xffffffffffffff98,(long)local_1e0);
      in_stack_fffffffffffffb98 = (_func_int **)(*pdVar4 * 0.5);
      in_stack_fffffffffffffba0 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                      (int64_t)in_stack_fffffffffffffb90);
      (in_stack_fffffffffffffba0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = in_stack_fffffffffffffb98;
      in_stack_fffffffffffffb90 = TPZVec<double>::operator[](&local_158,(long)local_1e0);
      in_stack_fffffffffffffb80 = (TPZManVector<double,_3> *)(*in_stack_fffffffffffffb90 * 0.25);
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = (double)in_stack_fffffffffffffb80;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffba0,(int64_t)in_stack_fffffffffffffb98,
                          (int64_t)in_stack_fffffffffffffb90);
      *pdVar4 = 0.0;
    }
    break;
  default:
    pzinternal::DebugStopImpl((char *)in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  }
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffb80);
  return;
}

Assistant:

void TPZPyramid::AdjustTopDirections(int ConstrainedFace,TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions)
    {
#ifdef PZDEBUG
        if (directions.Cols() != 58 || ConstrainedFace < 1 || ConstrainedFace > 4) {
            DebugStop();
        }
#endif
        int vectors[] = {11,18,25,32};
        TVar detjac = TPZAxesTools<TVar>::ComputeDetjac(gradx);
        
        TPZManVector<TVar,3> v1(3),v2(3),v3(3),ar9(3),ar10(3),ar11(3),ar12(3);
        for (int i=0; i<3; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
            v3[i] = gradx(i,2);
        }
        
        for (int i=0; i<3; i++) {
            v1[i] /= detjac;
            v2[i] /= detjac;
            v3[i] /= detjac;
            ar9[i] = v3[i]-(-v1[i]-v2[i]);
            ar10[i] = v3[i]-(v1[i]-v2[i]);
            ar11[i] = v3[i]-(v1[i]+v2[i]);
            ar12[i] = v3[i]-(v2[i]-v1[i]);
        }

        switch (ConstrainedFace) {
            case 1:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = 0.;
                    directions(i,vectors[1]) = ar12[i]/4.;
                    directions(i,vectors[2]) = v2[i]/2.;
                    directions(i,vectors[3]) = ar11[i]/4.;
                }
                break;
            case 2:

                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar12[i]/4.;
                    directions(i,vectors[1]) = 0.;
                    directions(i,vectors[2]) = ar9[i]/4.;
                    directions(i,vectors[3]) = -v1[i]/2.;
                }
                    
                break;
            case 3:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = -v2[i]/2.;
                    directions(i,vectors[1]) = ar9[i]/4.;
                    directions(i,vectors[2]) = 0.;
                    directions(i,vectors[3]) = ar10[i]/4.;
                }
                break;
            case 4:
                for (int i=0; i<3; i++) {
                    directions(i,vectors[0]) = ar11[i]/4.;
                    directions(i,vectors[1]) = v1[i]/2.;
                    directions(i,vectors[2]) = ar10[i]/4.;
                    directions(i,vectors[3]) = 0.;
                }
                break;
                
            default:
                DebugStop();
                break;
        }
    }